

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

Node * __thiscall
SuffixTree::GeneralizedSuffixTree::InsertNode
          (GeneralizedSuffixTree *this,uint letter,uint string,uint pos)

{
  char cVar1;
  uint uVar2;
  Node *parent;
  mapped_type *pmVar3;
  uint local_3c;
  int local_38;
  uint letter_local;
  
  local_3c = letter;
  letter_local = pos;
  if (this->active_length == 0) {
    __assert_fail("active_length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                  ,0x123,"Node *SuffixTree::GeneralizedSuffixTree::InsertNode(uint, uint, uint)");
  }
  parent = AllocNode(this,this->active_node,this->root);
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->active_node->edges,&this->active_edge);
  uVar2 = pmVar3->start + this->active_length;
  if (pmVar3->length == 0) {
    cVar1 = (this->strings).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[pmVar3->string_number]._M_dataplus._M_p[uVar2]
    ;
    local_38 = pmVar3->string_number << 8;
    if (cVar1 != '\0') {
      local_38 = (int)cVar1;
    }
  }
  else {
    cVar1 = (this->strings).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[pmVar3->string_number]._M_dataplus._M_p[uVar2]
    ;
    local_38 = pmVar3->string_number << 8;
    if (cVar1 != '\0') {
      local_38 = (int)cVar1;
    }
  }
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int,SuffixTree::Edge>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&parent->edges);
  ((pmVar3->field_0).node)->parent = parent;
  AllocLeaf(this,parent,string);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int&,SuffixTree::Edge>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&parent->edges,&local_3c);
  (pmVar3->field_0).node = parent;
  pmVar3->length = this->active_length;
  return parent;
}

Assistant:

Node *GeneralizedSuffixTree::InsertNode (uint letter, uint string, uint pos)
{
    // can not insert node if active point is not on edge
    assert (active_length);
    // create node
    Node *node = AllocNode (active_node, root);
    Edge &edge = active_node->edges[active_edge];
    // old branch
    uint old_pos = edge.start + active_length;
    if (edge.length)
    {
        node->edges.emplace (MakeLetter (strings[edge.string_number][old_pos], edge.string_number),
                             Edge (edge.node, edge.string_number, old_pos, edge.length - active_length));
        edge.node->parent = node;
    }
    else
    {
        node->edges.emplace (MakeLetter (strings[edge.string_number][old_pos], edge.string_number),
                             Edge (edge.leaf, edge.string_number, old_pos));
        edge.leaf->parent = node;
    }
    // new leaf
    node->edges.emplace (letter, Edge (AllocLeaf (node, string), string, pos));
    // setup parent
    edge.node = node;
    edge.length = active_length;
    return node;
}